

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O1

ostream * perf::operator<<(ostream *o,timer *timer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  duration *time;
  ostringstream strm;
  string local_1b8;
  long local_198;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  format_code_position
            (&local_1b8,(string *)(timer + 1),timer[2].m_start.__d.__r,(string *)(timer + 3));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  paVar1 = &local_1b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((ulong)timer[2].m_start.__d.__r < (ulong)timer[2].m_stop.__d.__r) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"-",1);
    std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,": ",2);
  local_198 = (timer->m_stop).__d.__r - (timer->m_start).__d.__r;
  format_duration_abi_cxx11_(&local_1b8,(perf *)&local_198,time);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            (o,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return o;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const inline_timer &timer)
    {
        std::ostringstream strm;
        strm << format_code_position(timer.m_file, timer.m_first_line, timer.m_function);
        if (timer.m_last_line > timer.m_first_line)
            strm << "-" << timer.m_last_line;
        strm << ": " << format_duration(timer.get_duration());
        o << strm.str();
        return o;
    }